

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O1

Dim * __thiscall
cnn::ConcatenateColumns::dim_forward
          (Dim *__return_storage_ptr__,ConcatenateColumns *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  long lVar2;
  invalid_argument *this_00;
  pointer pDVar3;
  uint uVar4;
  uint uVar5;
  ostringstream s;
  string local_1b0 [32];
  uint local_190 [94];
  
  pDVar3 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pDVar1 == pDVar3) {
    __assert_fail("xs.size() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes-common.cc"
                  ,0x1e5,
                  "virtual Dim cnn::ConcatenateColumns::dim_forward(const vector<Dim> &) const");
  }
  uVar4 = 1;
  local_190[0] = 1;
  if (pDVar3->nd != 0) {
    local_190[0] = pDVar3->d[0];
  }
  if (pDVar3 == pDVar1) {
    local_190[1] = 0;
  }
  else {
    uVar4 = 1;
    local_190[1] = 0;
    do {
      uVar5 = 1;
      if (pDVar3->nd != 0) {
        uVar5 = pDVar3->d[0];
      }
      if (uVar5 != local_190[0]) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_190,"Bad input dimensions in ConcatenateColumns: ",0x2c);
        operator<<((ostream *)local_190,xs);
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::invalid_argument::invalid_argument(this_00,local_1b0);
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      uVar5 = 1;
      if (1 < pDVar3->nd) {
        uVar5 = pDVar3->d[1];
      }
      local_190[1] = local_190[1] + uVar5;
      uVar5 = pDVar3->bd;
      if (pDVar3->bd < uVar4) {
        uVar5 = uVar4;
      }
      uVar4 = uVar5;
      pDVar3 = pDVar3 + 1;
    } while (pDVar3 != pDVar1);
  }
  __return_storage_ptr__->nd = 0;
  __return_storage_ptr__->bd = uVar4;
  lVar2 = 0;
  do {
    uVar4 = *(uint *)((long)local_190 + lVar2);
    uVar5 = __return_storage_ptr__->nd;
    __return_storage_ptr__->nd = uVar5 + 1;
    __return_storage_ptr__->d[uVar5] = uVar4;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 8);
  return __return_storage_ptr__;
}

Assistant:

Dim ConcatenateColumns::dim_forward(const vector<Dim>& xs) const {
  assert(xs.size() > 0);
  unsigned rows = xs[0][0];
  unsigned new_cols = 0;
  unsigned bd = 1;
  for (auto& d : xs) {
    if (d[0] != rows) {
      ostringstream s; s << "Bad input dimensions in ConcatenateColumns: " << xs;
      throw std::invalid_argument(s.str());
    }
    new_cols += d[1];
    bd = max(bd, d.bd);
  }
  return Dim({rows, new_cols}, bd);
}